

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  ParsedInput *pPVar2;
  ostream *poVar3;
  Polynomial *polynomial;
  _Base_ptr p_Var4;
  _Rb_tree<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::_Identity<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  *this;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  void *pvVar7;
  RationalNum **matrix;
  void *pvVar8;
  RationalNum *pRVar9;
  RationalNum **ppRVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> eigenValues;
  RationalNum eigenValue_1;
  set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  basis;
  map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
  eigenSpaces;
  _Rb_tree<RationalNum,_RationalNum,_std::_Identity<RationalNum>,_std::less<RationalNum>,_std::allocator<RationalNum>_>
  local_108;
  key_type local_d8;
  _Rb_tree<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::_Identity<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  local_c8;
  undefined1 local_98 [8];
  _Rb_tree_node_base _Stack_90;
  size_t local_70;
  _Rb_tree_node_base *local_60;
  _Rb_tree_node_base *local_58;
  string local_50;
  
  if (argc < 2) {
    pcVar16 = "You must write filename";
    lVar11 = 0x17;
  }
  else {
    std::__cxx11::string::string((string *)&local_50,argv[1],(allocator *)&local_108);
    pPVar2 = parseInput(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (pPVar2 != (ParsedInput *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Matrix:",7);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      if (pPVar2->n == 0) {
        uVar13 = 0;
      }
      else {
        uVar17 = 1;
        uVar18 = 0;
        do {
          if ((int)uVar17 != 0) {
            lVar11 = 0;
            uVar17 = 0;
            do {
              *(undefined8 *)
               (&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 3;
              poVar3 = operator<<((ostream *)&std::cout,
                                  (RationalNum *)((long)&pPVar2->matrix[uVar18]->numerator + lVar11)
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
              uVar17 = uVar17 + 1;
              lVar11 = lVar11 + 0x10;
            } while (uVar17 < pPVar2->n);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
          std::ostream::put(-0x20);
          std::ostream::flush();
          uVar18 = uVar18 + 1;
          uVar13 = pPVar2->n;
          uVar17 = (ulong)uVar13;
        } while (uVar18 < uVar17);
      }
      polynomial = getCharacteristicPolynomial(pPVar2->matrix,uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Characteristics polynomial:",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"F(x) = ",7);
      uVar17 = (ulong)polynomial->degree;
      if (-1 < (int)polynomial->degree) {
        pRVar9 = polynomial->coefficients;
        if (uVar17 != 0) {
          lVar11 = uVar17 << 4;
          do {
            RationalNum::RationalNum((RationalNum *)&local_108,1,1);
            bVar1 = operator==((RationalNum *)((long)&pRVar9->numerator + lVar11),
                               (RationalNum *)&local_108);
            iVar15 = (int)uVar17;
            if (bVar1) {
              lVar12 = 2;
              pcVar16 = "x^";
LAB_00104ab6:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pcVar16,lVar12);
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
LAB_00104ad5:
              std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            }
            else {
              pRVar9 = polynomial->coefficients;
              RationalNum::RationalNum((RationalNum *)&local_108,-1,1);
              bVar1 = operator==((RationalNum *)((long)&pRVar9->numerator + lVar11),
                                 (RationalNum *)&local_108);
              if (bVar1) {
                lVar12 = 4;
                pcVar16 = "- x^";
                goto LAB_00104ab6;
              }
              pRVar9 = polynomial->coefficients;
              RationalNum::RationalNum((RationalNum *)&local_108,0,1);
              bVar1 = operator>((RationalNum *)((long)&pRVar9->numerator + lVar11),
                                (RationalNum *)&local_108);
              if (bVar1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+ ",2);
                poVar3 = operator<<((ostream *)&std::cout,
                                    (RationalNum *)
                                    ((long)&polynomial->coefficients->numerator + lVar11));
                std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x^",2);
                poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar15);
                goto LAB_00104ad5;
              }
              pRVar9 = polynomial->coefficients;
              RationalNum::RationalNum((RationalNum *)&local_108,0,1);
              bVar1 = operator<((RationalNum *)((long)&pRVar9->numerator + lVar11),
                                (RationalNum *)&local_108);
              if (bVar1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- ",2);
                local_108._M_impl._0_16_ =
                     RationalNum::operator-
                               ((RationalNum *)((long)&polynomial->coefficients->numerator + lVar11)
                               );
                poVar3 = operator<<((ostream *)&std::cout,(RationalNum *)&local_108);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x^",2);
                poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
              }
            }
            lVar11 = lVar11 + -0x10;
            pRVar9 = polynomial->coefficients;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
        }
        RationalNum::RationalNum((RationalNum *)&local_108,0,1);
        bVar1 = operator>(pRVar9,(RationalNum *)&local_108);
        if (bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+ ",2);
          pRVar9 = polynomial->coefficients;
        }
        else {
          pRVar9 = polynomial->coefficients;
          RationalNum::RationalNum((RationalNum *)&local_108,0,1);
          bVar1 = operator<(pRVar9,(RationalNum *)&local_108);
          if (!bVar1) goto LAB_00104d0e;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- ",2);
          local_108._M_impl._0_16_ = RationalNum::operator-(polynomial->coefficients);
          pRVar9 = (RationalNum *)&local_108;
        }
        operator<<((ostream *)&std::cout,pRVar9);
      }
LAB_00104d0e:
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Rational eigenvalues: ",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      findRationalSolutions
                ((set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> *)
                 &local_108,polynomial);
      if ((_Rb_tree_header *)local_108._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_108._M_impl.super__Rb_tree_header) {
        iVar15 = 1;
        p_Var4 = local_108._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          local_98 = *(undefined1 (*) [8])(p_Var4 + 1);
          _Stack_90._0_8_ = p_Var4[1]._M_parent;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x_",2);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
          poVar3 = operator<<(poVar3,(RationalNum *)local_98);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
          iVar15 = iVar15 + 1;
        } while ((_Rb_tree_header *)p_Var4 != &local_108._M_impl.super__Rb_tree_header);
      }
      _Stack_90._M_left = &_Stack_90;
      _Stack_90._0_8_ = _Stack_90._0_8_ & 0xffffffff00000000;
      _Stack_90._M_parent = (_Base_ptr)0x0;
      local_70 = 0;
      _Stack_90._M_right = _Stack_90._M_left;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Eigenspaces: ",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      p_Var5 = local_108._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)local_108._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_108._M_impl.super__Rb_tree_header) {
        do {
          local_d8.numerator = *(longlong *)(p_Var5 + 1);
          local_d8.denominator = (longlong)p_Var5[1]._M_parent;
          getEigenSpaceBasis((set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                              *)&local_c8,pPVar2->matrix,pPVar2->n,*(RationalNum *)(p_Var5 + 1));
          this = &std::
                  map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                  ::operator[]((map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                                *)local_98,&local_d8)->_M_t;
          std::
          _Rb_tree<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::_Identity<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
          ::operator=(this,&local_c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"L(",2);
          poVar3 = operator<<((ostream *)&std::cout,&local_d8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,") = span ( ",0xb);
          for (p_Var4 = local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var4 != (_Rb_tree_node_base *)((long)&local_c8 + 8U);
              p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
            p_Var6 = *(_Base_ptr *)(p_Var4 + 1);
            if (p_Var4[1]._M_parent != p_Var6) {
              lVar11 = 0;
              uVar17 = 0;
              do {
                operator<<((ostream *)&std::cout,(RationalNum *)((long)&p_Var6->_M_color + lVar11));
                p_Var6 = *(_Base_ptr *)(p_Var4 + 1);
                uVar18 = (long)p_Var4[1]._M_parent - (long)p_Var6 >> 4;
                if (uVar17 < uVar18 - 1) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
                  p_Var6 = *(_Base_ptr *)(p_Var4 + 1);
                  uVar18 = (long)p_Var4[1]._M_parent - (long)p_Var6 >> 4;
                }
                uVar17 = uVar17 + 1;
                lVar11 = lVar11 + 0x10;
              } while (uVar17 < uVar18);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,") ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
          std::ostream::put(-0x20);
          std::ostream::flush();
          std::
          _Rb_tree<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::_Identity<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
          ::~_Rb_tree(&local_c8);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != &local_108._M_impl.super__Rb_tree_header);
      }
      p_Var4 = _Stack_90._M_left;
      if (_Stack_90._M_left == &_Stack_90) {
        uVar13 = 0;
      }
      else {
        uVar13 = 0;
        p_Var6 = _Stack_90._M_left;
        do {
          uVar13 = uVar13 + *(int *)&p_Var6[2]._M_right;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while (p_Var6 != &_Stack_90);
      }
      if (uVar13 < pPVar2->n) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Not enough eigen vectors to make eigen basis",0x2c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
      }
      else {
        uVar17 = (ulong)pPVar2->n << 3;
        pvVar7 = operator_new__(uVar17);
        matrix = (RationalNum **)operator_new__(uVar17);
        uVar17 = (ulong)pPVar2->n;
        if (pPVar2->n == 0) {
          uVar13 = 0;
        }
        else {
          uVar18 = 0;
          do {
            pvVar8 = operator_new__(uVar17 << 4);
            uVar14 = 0;
            do {
              RationalNum::RationalNum((RationalNum *)((long)pvVar8 + uVar14));
              uVar14 = uVar14 + 0x10;
            } while (uVar17 << 4 != uVar14);
            *(void **)((long)pvVar7 + uVar18 * 8) = pvVar8;
            uVar13 = pPVar2->n;
            uVar17 = (ulong)uVar13 << 4;
            pRVar9 = (RationalNum *)operator_new__(uVar17);
            if ((ulong)uVar13 != 0) {
              uVar14 = 0;
              do {
                RationalNum::RationalNum((RationalNum *)((long)&pRVar9->numerator + uVar14));
                uVar14 = uVar14 + 0x10;
              } while (uVar17 != uVar14);
            }
            matrix[uVar18] = pRVar9;
            uVar18 = uVar18 + 1;
            uVar13 = pPVar2->n;
            uVar17 = (ulong)uVar13;
            p_Var4 = _Stack_90._M_left;
          } while (uVar18 < uVar17);
        }
        if (p_Var4 != &_Stack_90) {
          lVar11 = 0;
          do {
            p_Var6 = p_Var4[2]._M_parent;
            p_Var5 = p_Var4;
            if (p_Var6 != (_Base_ptr)&p_Var4[1]._M_right) {
              local_58 = p_Var4 + 1;
              lVar11 = (long)(int)lVar11;
              local_60 = p_Var4;
              do {
                std::vector<RationalNum,_std::allocator<RationalNum>_>::vector
                          ((vector<RationalNum,_std::allocator<RationalNum>_> *)&local_c8,
                           (vector<RationalNum,_std::allocator<RationalNum>_> *)(p_Var6 + 1));
                RationalNum::operator=
                          ((RationalNum *)(*(long *)((long)pvVar7 + lVar11 * 8) + lVar11 * 0x10),
                           (RationalNum *)local_58);
                if (pPVar2->n != 0) {
                  lVar12 = 0;
                  uVar17 = 0;
                  do {
                    RationalNum::operator=
                              (matrix[uVar17] + lVar11,
                               (RationalNum *)((long)(longlong *)local_c8._M_impl._0_8_ + lVar12));
                    uVar17 = uVar17 + 1;
                    lVar12 = lVar12 + 0x10;
                  } while (uVar17 < pPVar2->n);
                }
                if ((pointer)local_c8._M_impl._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_c8._M_impl._0_8_,
                                  (long)local_c8._M_impl.super__Rb_tree_header._M_header._M_parent -
                                  local_c8._M_impl._0_8_);
                }
                lVar11 = lVar11 + 1;
                p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
                p_Var5 = local_60;
              } while (p_Var6 != (_Base_ptr)&p_Var4[1]._M_right);
            }
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          } while (p_Var4 != &_Stack_90);
          uVar13 = pPVar2->n;
        }
        ppRVar10 = getInverseMatrix(matrix,uVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Matrix decomposition: ",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"A = C D C^(-1)",0xe);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"C:",2);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        if (pPVar2->n != 0) {
          uVar17 = 1;
          uVar18 = 0;
          do {
            if ((int)uVar17 != 0) {
              lVar11 = 0;
              uVar17 = 0;
              do {
                poVar3 = operator<<((ostream *)&std::cout,
                                    (RationalNum *)((long)&matrix[uVar18]->numerator + lVar11));
                std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                uVar17 = uVar17 + 1;
                lVar11 = lVar11 + 0x10;
              } while (uVar17 < pPVar2->n);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
            std::ostream::put(-0x20);
            std::ostream::flush();
            uVar18 = uVar18 + 1;
            uVar17 = (ulong)pPVar2->n;
          } while (uVar18 < uVar17);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"D:",2);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        if (pPVar2->n != 0) {
          uVar17 = 1;
          uVar18 = 0;
          do {
            if ((int)uVar17 != 0) {
              pRVar9 = *(RationalNum **)((long)pvVar7 + uVar18 * 8);
              uVar17 = 0;
              do {
                poVar3 = operator<<((ostream *)&std::cout,pRVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                uVar17 = uVar17 + 1;
                pRVar9 = pRVar9 + 1;
              } while (uVar17 < pPVar2->n);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
            std::ostream::put(-0x20);
            std::ostream::flush();
            uVar18 = uVar18 + 1;
            uVar17 = (ulong)pPVar2->n;
          } while (uVar18 < uVar17);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"C^(-1):",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        if (pPVar2->n != 0) {
          uVar17 = 1;
          uVar18 = 0;
          do {
            if ((int)uVar17 != 0) {
              lVar11 = 0;
              uVar17 = 0;
              do {
                poVar3 = operator<<((ostream *)&std::cout,
                                    (RationalNum *)((long)&ppRVar10[uVar18]->numerator + lVar11));
                std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
                uVar17 = uVar17 + 1;
                lVar11 = lVar11 + 0x10;
              } while (uVar17 < pPVar2->n);
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
            std::ostream::put(-0x20);
            std::ostream::flush();
            uVar18 = uVar18 + 1;
            uVar17 = (ulong)pPVar2->n;
          } while (uVar18 < uVar17);
          if (pPVar2->n != 0) {
            uVar17 = 0;
            do {
              if (pPVar2->matrix[uVar17] != (RationalNum *)0x0) {
                operator_delete__(pPVar2->matrix[uVar17]);
              }
              pvVar8 = *(void **)((long)pvVar7 + uVar17 * 8);
              if (pvVar8 != (void *)0x0) {
                operator_delete__(pvVar8);
              }
              if (matrix[uVar17] != (RationalNum *)0x0) {
                operator_delete__(matrix[uVar17]);
              }
              if (ppRVar10[uVar17] != (RationalNum *)0x0) {
                operator_delete__(ppRVar10[uVar17]);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 < pPVar2->n);
          }
        }
        if (pPVar2->matrix != (RationalNum **)0x0) {
          operator_delete__(pPVar2->matrix);
        }
        operator_delete__(pvVar7);
        operator_delete__(matrix);
        if (ppRVar10 != (RationalNum **)0x0) {
          operator_delete__(ppRVar10);
        }
      }
      std::
      _Rb_tree<RationalNum,_std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>,_std::_Select1st<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<RationalNum,_std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>,_std::_Select1st<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                   *)local_98);
      std::
      _Rb_tree<RationalNum,_RationalNum,_std::_Identity<RationalNum>,_std::less<RationalNum>,_std::allocator<RationalNum>_>
      ::~_Rb_tree(&local_108);
      return 0;
    }
    pcVar16 = "Error while parsing filename";
    lVar11 = 0x1c;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,lVar11);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return -1;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 2) {
        cout << "You must write filename" << endl;
        return -1;
    }

    ParsedInput *input = parseInput(argv[1]);

    if (input == nullptr) {
        cout << "Error while parsing filename" << endl;
        return -1;
    }

    cout << "Matrix:" << endl;
    for (int i = 0; i < input->n; i++) {
        for (int j = 0; j < input->n; j++) {
            cout  << setw(3) << input->matrix[i][j] << " ";
        }
        cout << endl;
    }

    Polynomial *polynomial = getCharacteristicPolynomial(input->matrix, input->n);

    cout << "Characteristics polynomial:" << endl;
    cout << "F(x) = ";
    for (int i = polynomial->degree; i >= 0; i--) {
        if(i > 0) {
            if(polynomial->coefficients[i] == 1ll) {
                cout << "x^" << i << " ";
            }
            else if(polynomial->coefficients[i] == -1ll) {
                cout << "- x^" << i << " ";
            }
            else {
                if(polynomial->coefficients[i] > 0ll) cout << "+ " << polynomial->coefficients[i] << " " << "x^" << i << " ";
                else if(polynomial->coefficients[i] < 0ll) cout << "- " << -polynomial->coefficients[i] << " " << "x^" << i << " ";
            }
        }
        else if(i == 0) {
            if(polynomial->coefficients[i] > 0ll) cout << "+ " << polynomial->coefficients[i];
            else if(polynomial->coefficients[i] < 0ll) cout << "- " << -polynomial->coefficients[i];
        }
    }
    cout << endl;

    cout << "Rational eigenvalues: " << endl;
    set<RationalNum> eigenValues = findRationalSolutions(polynomial);

    int m = 1;
    for(auto eigenValue : eigenValues) {
        cout << "x_" << m++ << " = " << eigenValue << endl;
    }

    map<RationalNum, set<vector<RationalNum>>> eigenSpaces;
    cout << "Eigenspaces: " << endl;
    for(auto eigenValue : eigenValues) {
        set<vector<RationalNum>> basis = getEigenSpaceBasis(input->matrix, input->n, eigenValue);
        eigenSpaces[eigenValue] = basis;
        cout << "L(" << eigenValue << ") = span ( ";
        for(const auto& vector : basis) {
            cout << "(";
            for(int i = 0; i < vector.size(); i++) {
                cout << vector[i];
                if(i < vector.size() - 1) cout << ", ";
            }
            cout << ") ";
        }
        cout << ")" << endl;
    }

    int basisVectorsCount = 0;
    for(const auto& space : eigenSpaces) basisVectorsCount += space.second.size();

    if(basisVectorsCount < input->n) {
        cout << "Not enough eigen vectors to make eigen basis" << endl;
        return 0;
    }

    RationalNum** D = new RationalNum* [input->n];
    RationalNum** C = new RationalNum* [input->n];
    for(int i = 0; i < input->n; i++) {
        D[i] = new RationalNum [input->n];
        C[i] = new RationalNum [input->n];
    }

    m = 0;
    for(const auto& space : eigenSpaces) {
        for(auto basisVector : space.second) {
            D[m][m] = space.first;
            for (int j = 0; j < input->n; j++) C[j][m] = basisVector[j];
            m++;
        }
    }

    RationalNum** C1 = getInverseMatrix(C, input->n);

    cout << "Matrix decomposition: " << endl;
    cout << "A = C D C^(-1)" << endl;
    cout << "C:" << endl;
    for(int i = 0; i < input->n; i++) {
        for(int j = 0; j < input->n; j++) cout << C[i][j] << " ";
        cout << endl;
    }
    cout << "D:" << endl;
    for(int i = 0; i < input->n; i++) {
        for(int j = 0; j < input->n; j++) cout << D[i][j] << " ";
        cout << endl;
    }
    cout << "C^(-1):" << endl;
    for(int i = 0; i < input->n; i++) {
        for(int j = 0; j < input->n; j++) cout << C1[i][j] << " ";
        cout << endl;
    }

    //Освобождение памяти
    for(int i =0 ; i < input->n; i++) {
        delete [] input->matrix[i];
        delete [] D[i];
        delete [] C[i];
        delete [] C1[i];
    }
    delete[] input->matrix;
    delete [] D;
    delete [] C;
    delete [] C1;

    return 0;
}